

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.h
# Opt level: O1

bool __thiscall QLineEditPrivate::shouldShowPlaceholderText(QLineEditPrivate *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayData *local_50;
  long local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetLineControl::text(&local_38,(QWidgetLineControl *)this->control);
  if (local_38.d.size == 0) {
    QTextLayout::preeditAreaText();
    if (local_40 == 0) {
      bVar1 = true;
      if ((this->alignment & 4) != 0) {
        bVar1 = QWidget::hasFocus(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
        bVar1 = !bVar1;
      }
      goto LAB_0042598d;
    }
  }
  bVar1 = false;
LAB_0042598d:
  if ((local_38.d.size == 0) && (local_50 != (QArrayData *)0x0)) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool shouldShowPlaceholderText() const
    {
        return control->text().isEmpty() && control->preeditAreaText().isEmpty()
                && !((alignment & Qt::AlignHCenter) && q_func()->hasFocus());
    }